

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::PrimitiveFieldGenerator::GenerateMembers
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pfVar1;
  char cVar2;
  bool bVar3;
  Options *options;
  char *pcVar4;
  size_t sVar5;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string property_name;
  string default_value;
  undefined1 local_e8 [40];
  char *local_c0;
  long local_b8 [2];
  AlphaNum local_a8;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_78 [2];
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_48;
  
  cVar2 = google::protobuf::FieldDescriptor::has_presence();
  pfVar1 = &(this->super_FieldGeneratorBase).variables_;
  if (cVar2 == '\0') {
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>(local_78,pfVar1,(char (*) [14])0x41423a);
    local_a8.piece_._M_len = (size_t)local_a8.digits_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,*(long *)((long)local_78[0].first.field_1.slot_ + 0x10),
               *(long *)((long)local_78[0].first.field_1.slot_ + 0x18) +
               *(long *)((long)local_78[0].first.field_1.slot_ + 0x10));
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[21]>(local_78,pfVar1,(char (*) [21])"default_value_access");
    std::__cxx11::string::operator=
              ((string *)((long)local_78[0].first.field_1.slot_ + 0x10),(string *)&local_a8);
    pcVar4 = (char *)local_a8.piece_._M_len;
    if ((char *)local_a8.piece_._M_len == local_a8.digits_) goto LAB_0023dc78;
  }
  else {
    text_02._M_str =
         "private readonly static $type_name$ $property_name$DefaultValue = $default_value$;\n\n";
    text_02._M_len = 0x54;
    io::Printer::
    Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,pfVar1,text_02);
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[14]>
              ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_a8,pfVar1,(char (*) [14])0x3f7893);
    local_e8._32_8_ = local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_e8 + 0x20),*(long *)(local_a8.piece_._M_str + 0x10),
               *(long *)(local_a8.piece_._M_str + 0x18) + *(long *)(local_a8.piece_._M_str + 0x10));
    local_a8.piece_._M_len = (size_t)local_c0;
    local_a8.piece_._M_str = (char *)local_e8._32_8_;
    local_78[0].first.ctrl_ = (ctrl_t *)0xc;
    local_78[0].first.field_1.slot_ = (slot_type *)0x38c444;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_e8,&local_a8);
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[21]>(&local_48,pfVar1,(char (*) [21])"default_value_access");
    std::__cxx11::string::operator=
              ((string *)((long)local_48.first.field_1.slot_ + 0x10),(string *)local_e8);
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    local_a8.digits_._0_8_ = local_b8[0];
    pcVar4 = (char *)local_e8._32_8_;
    if ((long *)local_e8._32_8_ == local_b8) goto LAB_0023dc78;
  }
  operator_delete(pcVar4,local_a8.digits_._0_8_ + 1);
LAB_0023dc78:
  pfVar1 = &(this->super_FieldGeneratorBase).variables_;
  text_03._M_str = "private $type_name$ $name_def_message$;\n";
  text_03._M_len = 0x28;
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,pfVar1,text_03);
  options = SourceGeneratorBase::options((SourceGeneratorBase *)this);
  WritePropertyDocComment(printer,options,(this->super_FieldGeneratorBase).descriptor_);
  FieldGeneratorBase::AddPublicMemberAttributes(&this->super_FieldGeneratorBase,printer);
  text_04._M_str = "$access_level$ $type_name$ $property_name$ {\n";
  text_04._M_len = 0x2d;
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,pfVar1,text_04);
  if (((this->super_FieldGeneratorBase).descriptor_[2] == (FieldDescriptor)0xb) ||
     (cVar2 = google::protobuf::FieldDescriptor::has_presence(), cVar2 == '\0')) {
    pcVar4 = "  get { return $name$_; }\n";
    sVar5 = 0x1a;
  }
  else {
    bVar3 = IsNullable((this->super_FieldGeneratorBase).descriptor_);
    if (bVar3) {
      pcVar4 = "  get { return $name$_ ?? $default_value_access$; }\n";
      sVar5 = 0x34;
    }
    else {
      pcVar4 = 
      "  get { if ($has_field_check$) { return $name$_; } else { return $default_value_access$; } }\n"
      ;
      sVar5 = 0x5d;
    }
  }
  text_05._M_str = pcVar4;
  text_05._M_len = sVar5;
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,pfVar1,text_05);
  text._M_str = "  set {\n";
  text._M_len = 8;
  io::Printer::Print<>(printer,text);
  if ((this->super_FieldGeneratorBase).presenceIndex_ != -1) {
    text_06._M_str = "    $set_has_field$;\n";
    text_06._M_len = 0x15;
    io::Printer::
    Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,pfVar1,text_06);
  }
  if (this->is_value_type == true) {
    pcVar4 = "    $name$_ = value;\n";
    sVar5 = 0x15;
  }
  else {
    pcVar4 = "    $name$_ = pb::ProtoPreconditions.CheckNotNull(value, \"value\");\n";
    sVar5 = 0x43;
  }
  text_07._M_str = pcVar4;
  text_07._M_len = sVar5;
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,pfVar1,text_07);
  text_00._M_str = "  }\n}\n";
  text_00._M_len = 6;
  io::Printer::Print<>(printer,text_00);
  if (((this->super_FieldGeneratorBase).descriptor_[2] != (FieldDescriptor)0xb) &&
     (cVar2 = google::protobuf::FieldDescriptor::has_presence(), cVar2 != '\0')) {
    text_08._M_str = "/// <summary>Gets whether the \"$descriptor_name$\" field is set</summary>\n";
    text_08._M_len = 0x49;
    io::Printer::
    Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,pfVar1,text_08);
    FieldGeneratorBase::AddPublicMemberAttributes(&this->super_FieldGeneratorBase,printer);
    text_09._M_str = "$access_level$ bool Has$property_name$ {\n  get { return ";
    text_09._M_len = 0x38;
    io::Printer::
    Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,pfVar1,text_09);
    bVar3 = IsNullable((this->super_FieldGeneratorBase).descriptor_);
    if (bVar3) {
      pcVar4 = "$name$_ != null; }\n}\n";
      sVar5 = 0x15;
    }
    else {
      pcVar4 = "$has_field_check$; }\n}\n";
      sVar5 = 0x17;
    }
    text_10._M_str = pcVar4;
    text_10._M_len = sVar5;
    io::Printer::
    Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,pfVar1,text_10);
  }
  if (((this->super_FieldGeneratorBase).descriptor_[2] != (FieldDescriptor)0xb) &&
     (cVar2 = google::protobuf::FieldDescriptor::has_presence(), cVar2 != '\0')) {
    text_11._M_str = "/// <summary>Clears the value of the \"$descriptor_name$\" field</summary>\n";
    text_11._M_len = 0x49;
    io::Printer::
    Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,pfVar1,text_11);
    FieldGeneratorBase::AddPublicMemberAttributes(&this->super_FieldGeneratorBase,printer);
    text_12._M_str = "$access_level$ void Clear$property_name$() {\n";
    text_12._M_len = 0x2d;
    io::Printer::
    Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,pfVar1,text_12);
    bVar3 = IsNullable((this->super_FieldGeneratorBase).descriptor_);
    if (bVar3) {
      pcVar4 = "  $name$_ = null;\n";
      sVar5 = 0x12;
    }
    else {
      pcVar4 = "  $clear_has_field$;\n";
      sVar5 = 0x15;
    }
    text_13._M_str = pcVar4;
    text_13._M_len = sVar5;
    io::Printer::
    Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,pfVar1,text_13);
    text_01._M_str = "}\n";
    text_01._M_len = 2;
    io::Printer::Print<>(printer,text_01);
  }
  return;
}

Assistant:

void PrimitiveFieldGenerator::GenerateMembers(io::Printer* printer) {
  // Note: in multiple places, this code assumes that all fields
  // that support presence are either nullable, or use a presence field bit.
  // Fields which are oneof members are not generated here; they're generated in PrimitiveOneofFieldGenerator below.
  // Extensions are not generated here either.

  // Explicit presence allows different default values to be specified. These
  // are retained via static fields. They don't particularly need to be, but we
  // don't need to change that. Under implicit presence we don't use static
  // fields for default values and just use the literals instead.
  if (descriptor_->has_presence()) {
    // Note: "private readonly static" isn't as idiomatic as
    // "private static readonly", but changing this now would create a lot of
    // churn in generated code with near-to-zero benefit.
    printer->Print(
      variables_,
      "private readonly static $type_name$ $property_name$DefaultValue = $default_value$;\n\n");
    std::string property_name = variables_["property_name"];
    variables_["default_value_access"] =
        absl::StrCat(property_name, "DefaultValue");
  } else {
    std::string default_value = variables_["default_value"];
    variables_["default_value_access"] = std::move(default_value);
  }

  // Declare the field itself.
  printer->Print(
    variables_,
    "private $type_name$ $name_def_message$;\n");

  WritePropertyDocComment(printer, options(), descriptor_);
  AddPublicMemberAttributes(printer);

  // Most of the work is done in the property:
  // Declare the property itself (the same for all options)
  printer->Print(variables_, "$access_level$ $type_name$ $property_name$ {\n");

  // Specify the "getter", which may need to check for a presence field.
  if (SupportsPresenceApi(descriptor_)) {
    if (IsNullable(descriptor_)) {
      printer->Print(
        variables_,
        "  get { return $name$_ ?? $default_value_access$; }\n");
    } else {
      printer->Print(
        variables_,
        // Note: it's possible that this could be rewritten as a
        // conditional ?: expression, but there's no significant benefit
        // to changing it.
        "  get { if ($has_field_check$) { return $name$_; } else { return $default_value_access$; } }\n");
    }
  } else {
    printer->Print(
      variables_,
      "  get { return $name$_; }\n");
  }

  // Specify the "setter", which may need to set a field bit as well as the
  // value.
  printer->Print("  set {\n");
  if (presenceIndex_ != -1) {
    printer->Print(
      variables_,
      "    $set_has_field$;\n");
  }
  if (is_value_type) {
    printer->Print(
      variables_,
      "    $name$_ = value;\n");
  } else {
    printer->Print(
      variables_,
      "    $name$_ = pb::ProtoPreconditions.CheckNotNull(value, \"value\");\n");
  }
  printer->Print(
    "  }\n"
    "}\n");

  // The "HasFoo" property, where required.
  if (SupportsPresenceApi(descriptor_)) {
    printer->Print(variables_,
      "/// <summary>Gets whether the \"$descriptor_name$\" field is set</summary>\n");
    AddPublicMemberAttributes(printer);
    printer->Print(
      variables_,
      "$access_level$ bool Has$property_name$ {\n"
      "  get { return ");
    if (IsNullable(descriptor_)) {
      printer->Print(
        variables_,
        "$name$_ != null; }\n}\n");
    } else {
      printer->Print(
        variables_,
        "$has_field_check$; }\n}\n");
    }
  }

  // The "ClearFoo" method, where required.
  if (SupportsPresenceApi(descriptor_)) {
    printer->Print(variables_,
      "/// <summary>Clears the value of the \"$descriptor_name$\" field</summary>\n");
    AddPublicMemberAttributes(printer);
    printer->Print(
      variables_,
      "$access_level$ void Clear$property_name$() {\n");
    if (IsNullable(descriptor_)) {
      printer->Print(variables_, "  $name$_ = null;\n");
    } else {
      printer->Print(variables_, "  $clear_has_field$;\n");
    }
    printer->Print("}\n");
  }
}